

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildHeapBufferReload(IRBuilderAsmJs *this,uint32 offset,bool isFirstLoad)

{
  int32 iVar1;
  bool bVar2;
  bool bVar3;
  JITTimeFunctionBody *pJVar4;
  AsmJsJITInfo *this_00;
  RegOpnd *pRVar5;
  RegOpnd *pRVar6;
  IndirOpnd *pIVar7;
  Instr *pIVar8;
  RegSlot srcRegSlot;
  RegSlot dstRegSlot;
  int32 offset_00;
  RegSlot local_48;
  int32 local_44;
  int32 local_40;
  
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(pJVar4);
  pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar4);
  bVar3 = AsmJsJITInfo::IsSharedMemory(this_00);
  if (bVar2) {
    if (isFirstLoad) {
      pRVar5 = BuildDstOpnd(this,3,TyVar);
      pRVar6 = BuildSrcOpnd(this,1,TyVar);
      pIVar7 = IR::IndirOpnd::New(pRVar6,0,TyVar,this->m_func,false);
      pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
      AddInstr(this,pIVar8,offset);
    }
    if (bVar3) {
      iVar1 = 0x10;
      local_40 = 0x10;
      if (!isFirstLoad) {
        local_48 = 6;
        goto LAB_004fcee4;
      }
      local_44 = 0x28;
      offset_00 = 0x20;
      srcRegSlot = 3;
      local_48 = 6;
      dstRegSlot = 6;
      goto LAB_004fccbd;
    }
    pRVar5 = BuildDstOpnd(this,2,TyVar);
    pRVar6 = BuildSrcOpnd(this,3,TyVar);
    pIVar7 = IR::IndirOpnd::New(pRVar6,0x20,TyVar,this->m_func,false);
    pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
    AddInstr(this,pIVar8,offset);
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar2 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(pJVar4);
    dstRegSlot = 7;
    pRVar5 = BuildDstOpnd(this,7,TyVar);
    pRVar6 = BuildSrcOpnd(this,2,TyVar);
    pIVar7 = IR::IndirOpnd::New(pRVar6,0x38,TyVar,this->m_func,false);
    pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
    AddInstr(this,pIVar8,offset);
    local_48 = 2;
    local_40 = 0x40;
    iVar1 = 0x40;
    if (bVar2 && !isFirstLoad) goto LAB_004fcee4;
  }
  else {
    if (!isFirstLoad) {
      return;
    }
    iVar1 = 0x40;
    local_48 = 2;
    local_44 = 0x38;
    dstRegSlot = 7;
    offset_00 = 0;
    srcRegSlot = 1;
LAB_004fccbd:
    pRVar5 = BuildDstOpnd(this,2,TyVar);
    pRVar6 = BuildSrcOpnd(this,srcRegSlot,TyVar);
    pIVar7 = IR::IndirOpnd::New(pRVar6,offset_00,TyVar,this->m_func,false);
    pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
    AddInstr(this,pIVar8,offset);
    pRVar5 = BuildDstOpnd(this,dstRegSlot,TyVar);
    pRVar6 = BuildSrcOpnd(this,2,TyVar);
    pIVar7 = IR::IndirOpnd::New(pRVar6,local_44,TyVar,this->m_func,false);
    pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
    AddInstr(this,pIVar8,offset);
  }
  local_40 = iVar1;
  pRVar5 = BuildDstOpnd(this,4,TyVar);
  pRVar6 = BuildSrcOpnd(this,dstRegSlot,TyVar);
  pIVar7 = IR::IndirOpnd::New(pRVar6,0,TyVar,this->m_func,false);
  pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
  AddInstr(this,pIVar8,offset);
LAB_004fcee4:
  pRVar5 = BuildDstOpnd(this,5,TyUint32);
  pRVar6 = BuildSrcOpnd(this,local_48,TyUint32);
  pIVar7 = IR::IndirOpnd::New(pRVar6,local_40,TyUint32,this->m_func,false);
  pIVar8 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pIVar7->super_Opnd,this->m_func);
  AddInstr(this,pIVar8,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildHeapBufferReload(uint32 offset, bool isFirstLoad)
{
    enum ShouldReload
    {
        DoReload,
        DontReload
    };
    const auto AddLoadField = [&](AsmJsRegSlots::ConstSlots dst, AsmJsRegSlots::ConstSlots src, int32 fieldOffset, IRType type, ShouldReload shouldReload)
    {
        if (isFirstLoad || shouldReload == DoReload)
        {
            IR::RegOpnd * dstOpnd = BuildDstOpnd(dst, type);
            IR::Opnd * srcOpnd = IR::IndirOpnd::New(BuildSrcOpnd(src, type), fieldOffset, type, m_func);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            AddInstr(instr, offset);
        }
    };

#ifdef ENABLE_WASM
    const bool isWasm = m_func->GetJITFunctionBody()->IsWasmFunction();
    const bool isSharedMem = m_func->GetJITFunctionBody()->GetAsmJsInfo()->IsSharedMemory();

    if(isWasm)
    {
        // WebAssembly.Memory only needs to be loaded once as it can't change over the course of the function
        AddLoadField(AsmJsRegSlots::WasmMemoryReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::WebAssemblyModule::GetMemoryOffset(), TyVar, DontReload);

        if (!isSharedMem)
        {
            // ArrayBuffer
            // GrowMemory can change the ArrayBuffer, we have to reload it
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DoReload);

            // The buffer doesn't change when using Fast Virtual buffer even if we grow the memory
            ShouldReload shouldReloadBufferPointer = m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer() ? DontReload : DoReload;

            // ArrayBuffer.bufferContent
            AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DoReload);

            // RefCountedBuffer.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, shouldReloadBufferPointer);
            // ArrayBuffer.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DoReload);
        }
        else
        {
            // SharedArrayBuffer
            // SharedArrayBuffer cannot be detached and the buffer cannot change, no need to reload
            AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::WasmMemoryReg, Js::WebAssemblyMemory::GetOffsetOfArrayBuffer(), TyVar, DontReload);
            // SharedArrayBuffer.SharedContents
            AddLoadField(AsmJsRegSlots::SharedContents, AsmJsRegSlots::ArrayReg, Js::SharedArrayBuffer::GetSharedContentsOffset(), TyVar, DontReload);
            // SharedContents.buffer
            AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferOffset(), TyVar, DontReload);
            // SharedContents.length
            AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::SharedContents, Js::SharedContents::GetBufferLengthOffset(), TyUint32, DoReload);
        }
    }
    else
#endif
    {
        // ArrayBuffer
        // The ArrayBuffer can be changed on the environment, if it is detached, we'll throw
        AddLoadField(AsmJsRegSlots::ArrayReg, AsmJsRegSlots::ModuleMemReg, (int32)Js::AsmJsModuleMemory::MemoryTableBeginOffset, TyVar, DontReload);
        // ArrayBuffer.bufferContent
        AddLoadField(AsmJsRegSlots::RefCountedBuffer, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetBufferContentsOffset(), TyVar, DontReload);
        // RefCountedBuffer.buffer
        AddLoadField(AsmJsRegSlots::BufferReg, AsmJsRegSlots::RefCountedBuffer, Js::RefCountedBuffer::GetBufferOffset(), TyVar, DontReload);
        // ArrayBuffer.length
        AddLoadField(AsmJsRegSlots::LengthReg, AsmJsRegSlots::ArrayReg, Js::ArrayBuffer::GetByteLengthOffset(), TyUint32, DontReload);
    }
}